

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::detail::logTestStart(char *name,char *file,uint line)

{
  bool bVar1;
  ContextState *pCVar2;
  char *pcVar3;
  pointer pSVar4;
  ulong uVar5;
  Color *pCVar6;
  String this;
  ulong uVar7;
  String subcaseStuff;
  char msg [1024];
  char subcase [1024];
  char loc [1024];
  String local_c80;
  String local_c78;
  String local_c70;
  String local_c68;
  String local_c60;
  String local_c58;
  String local_c50;
  String local_c48;
  String local_c40;
  Color local_c38 [1024];
  String local_838 [128];
  char local_438 [1032];
  
  pcVar3 = fileForOutput(file);
  snprintf(local_438,0x400,"%s(%d)\n",pcVar3,(ulong)line);
  pCVar6 = local_c38;
  snprintf((char *)pCVar6,0x400,"%s\n");
  Color::use(pCVar6,Yellow);
  pCVar6 = (Color *)&DAT_0014e949;
  puts("===============================================================================");
  Color::use(pCVar6,None);
  if (local_438[0] != '\0') {
    Color::use(pCVar6,LightGrey);
    pCVar6 = (Color *)0x14a3de;
    printf("%s");
    Color::use(pCVar6,None);
  }
  if (local_c38[0] != (Color)0x0) {
    Color::use(pCVar6,None);
    pCVar6 = (Color *)0x14a3de;
    printf("%s");
    Color::use(pCVar6,None);
  }
  this.m_str = (char *)&local_c80;
  String::String((String *)this.m_str,"");
  pCVar2 = getContextState::data;
  pSVar4 = (getContextState::data->subcasesStack).
           super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((getContextState::data->subcasesStack).
      super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar4) {
    uVar5 = 0;
    uVar7 = 1;
    do {
      pCVar6 = (Color *)local_838;
      snprintf((char *)local_838,0x400,"  %s\n",pSVar4[uVar5].m_signature.m_name);
      if (local_838[0].m_str._0_1_ != (Color)0x0) {
        Color::use(pCVar6,None);
        pCVar6 = (Color *)0x14a3de;
        printf("%s");
        Color::use(pCVar6,None);
      }
      String::String(&local_c78,(char *)local_838);
      String::operator+=(&local_c80,&local_c78);
      this.m_str = local_c78.m_str;
      free(local_c78.m_str);
      pSVar4 = (pCVar2->subcasesStack).
               super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar7 < (ulong)((long)(pCVar2->subcasesStack).
                                    super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 5);
      uVar5 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar1);
  }
  Color::use((Color *)this.m_str,None);
  pCVar6 = (Color *)0xa;
  putchar(10);
  Color::use(pCVar6,None);
  String::String(&local_c68,
                 "===============================================================================\n"
                );
  String::String(&local_c70,local_438);
  String::operator+(&local_c60,&local_c68);
  String::String(&local_c48,(char *)local_c38);
  String::operator+(&local_c40,&local_c60);
  String::String(&local_c50,local_c80.m_str);
  String::operator+(&local_c78,&local_c40);
  String::String(&local_c58,"\n");
  String::operator+(local_838,&local_c78);
  free((void *)CONCAT71(local_838[0].m_str._1_7_,local_838[0].m_str._0_1_));
  free(local_c58.m_str);
  free(local_c78.m_str);
  free(local_c50.m_str);
  free(local_c40.m_str);
  free(local_c48.m_str);
  free(local_c60.m_str);
  free(local_c70.m_str);
  free(local_c68.m_str);
  free(local_c80.m_str);
  return;
}

Assistant:

void logTestStart(const char* name, const char* file, unsigned line) {
        const char* newLine = "\n";

        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)\n", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), "%s\n", name);

        DOCTEST_PRINTF_COLORED(getSeparator(), Color::Yellow);
        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, Color::None);

        String                subcaseStuff  = "";
        std::vector<Subcase>& subcasesStack = getContextState()->subcasesStack;
        for(unsigned i = 0; i < subcasesStack.size(); ++i) {
            char subcase[DOCTEST_SNPRINTF_BUFFER_LENGTH];
            DOCTEST_SNPRINTF(subcase, DOCTEST_COUNTOF(loc), "  %s\n",
                             subcasesStack[i].m_signature.m_name);
            DOCTEST_PRINTF_COLORED(subcase, Color::None);
            subcaseStuff += subcase;
        }

        DOCTEST_PRINTF_COLORED(newLine, Color::None);

        printToDebugConsole(String(getSeparator()) + loc + msg + subcaseStuff.c_str() + newLine);
    }